

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O0

void __thiscall beast::SemanticVersion::SemanticVersion(SemanticVersion *this,string *version)

{
  bool bVar1;
  invalid_argument *this_00;
  string *version_local;
  SemanticVersion *this_local;
  
  SemanticVersion(this);
  bVar1 = parse(this,version);
  if (!bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid version string");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

SemanticVersion::SemanticVersion (std::string const& version)
    : SemanticVersion ()
{
    if (!parse (version))
        throw std::invalid_argument ("invalid version string");
}